

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void asl::Random::getBytes(void *buffer,int n)

{
  int iVar1;
  size_t sVar2;
  int local_44;
  undefined1 local_40 [4];
  int i;
  Random random;
  FILE *f;
  int n_local;
  void *buffer_local;
  
  random._state[3] = (ULong)fopen("/dev/urandom","rb");
  if ((FILE *)random._state[3] != (FILE *)0x0) {
    sVar2 = fread(buffer,1,(long)n,(FILE *)random._state[3]);
    if ((int)sVar2 == n) {
      fclose((FILE *)random._state[3]);
      return;
    }
    fclose((FILE *)random._state[3]);
  }
  Random((Random *)local_40,true,true);
  for (local_44 = 0; local_44 < n; local_44 = local_44 + 1) {
    iVar1 = operator()((Random *)local_40,0xff);
    *(char *)((long)buffer + (long)local_44) = (char)iVar1;
  }
  return;
}

Assistant:

void Random::getBytes(void* buffer, int n)
{
#ifdef _WIN32
	HCRYPTPROV cp = 0;
	if (CryptAcquireContextW(&cp, NULL, NULL, PROV_RSA_FULL, 0))
	{
		if (CryptGenRandom(cp, n, (BYTE*)buffer))
		{
			CryptReleaseContext(cp, 0);
			return;
		}
	}
#else
	FILE* f = fopen("/dev/urandom", "rb");
	if (f)
	{
		if((int)fread(buffer, 1, n, f) == n) {
			fclose(f);
			return;
		}
		fclose(f);
	}
#endif
	Random random;
	for(int i=0; i<n; i++)
		((byte*)buffer)[i] = (byte)random(255);
}